

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O2

void __thiscall DRAG<RemSP>::PerformLabeling(DRAG<RemSP> *this)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int r;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint local_d8;
  Size local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar10 = (long)*(int *)&pMVar4->field_0x8;
  lVar21 = (long)*(int *)&pMVar4->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar4->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar4->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  RemSP::Alloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  for (uVar15 = 0; (long)uVar15 < lVar10; uVar15 = uVar15 + 2) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar13 = **(long **)&pMVar4->field_0x48;
    lVar14 = lVar13 * uVar15 + *(long *)&pMVar4->field_0x10;
    lVar22 = lVar14 - lVar13;
    lVar17 = lVar22 - lVar13;
    lVar13 = lVar13 + lVar14;
    lVar12 = **(long **)&pMVar5->field_0x48;
    lVar23 = lVar12 * uVar15 + *(long *)&pMVar5->field_0x10;
    lVar19 = lVar23 + lVar12 * -2;
    lVar12 = lVar17 + -1;
    uVar20 = uVar15 | 1;
    for (uVar24 = 0; (long)uVar24 < lVar21; uVar24 = uVar24 + 2) {
      if (*(char *)(lVar14 + uVar24) == '\0') {
        if (((long)uVar20 < lVar10) && (*(char *)(lVar13 + uVar24) != '\0')) {
          uVar11 = uVar24 | 1;
          if (((long)uVar11 < lVar21) && (*(char *)(lVar14 + uVar11) != '\0')) {
            uVar9 = 1;
            if (uVar24 != 0) {
              if (*(char *)((uVar24 - 1) + lVar14) != '\0') {
                if (uVar15 != 0) {
                  if (*(char *)(lVar22 + uVar11) == '\0') goto LAB_00119f6b;
                  goto LAB_00119e5f;
                }
                goto LAB_0011a3c9;
              }
              uVar9 = uVar11;
              if (*(char *)(lVar13 + -1 + uVar24) == '\0') goto LAB_00119f0f;
              if (uVar15 == 0) goto LAB_0011a3c9;
              if (*(char *)(lVar22 + uVar11) == '\0') {
                if ((lVar21 <= (long)(uVar24 + 2)) || (*(char *)(lVar22 + uVar24 + 2) == '\0')) {
                  if (*(char *)(lVar22 + uVar24) == '\0') goto LAB_0011a3c9;
                  cVar3 = *(char *)((uVar24 - 2) + lVar14);
                  goto joined_r0x0011a3be;
                }
                if (*(char *)(lVar17 + uVar11) == '\0') {
                  if (*(char *)(lVar22 + uVar24) == '\0') goto LAB_00119f9e;
                  if (*(char *)(lVar14 + -2 + uVar24) == '\0') {
                    uVar8 = RemSP::Merge(*(uint *)(lVar19 + uVar24 * 4),
                                         *(uint *)(lVar19 + 8 + uVar24 * 4));
                    uVar16 = *(uint *)(lVar23 + -8 + uVar24 * 4);
                  }
                  else {
                    if (*(char *)(lVar22 + -1 + uVar24) == '\0') goto LAB_0011a3ef;
                    uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
                    uVar16 = *(uint *)(lVar19 + 8 + uVar24 * 4);
                  }
                  uVar8 = RemSP::Merge(uVar8,uVar16);
                  *(uint *)(lVar23 + uVar24 * 4) = uVar8;
                  goto LAB_0011a3d2;
                }
              }
              if (*(char *)((uVar24 - 2) + lVar14) == '\0') goto LAB_0011a2c5;
LAB_00119fe6:
              if (uVar24 != 0 && uVar15 != 0) {
                if (*(char *)(lVar22 + -1 + uVar24) != '\0') {
LAB_0011a19e:
                  if (uVar15 != 0) {
                    if (*(char *)(lVar22 + uVar24) != '\0') goto LAB_0011a106;
                    goto LAB_0011a059;
                  }
                  goto LAB_0011a1df;
                }
LAB_0011a00a:
                if (*(char *)(lVar22 + -2 + uVar24) != '\0') {
                  if (*(char *)(lVar12 + uVar24) != '\0') goto LAB_0011a19e;
                  goto LAB_0011a1df;
                }
              }
LAB_0011a289:
              uVar8 = *(uint *)(lVar19 + uVar24 * 4);
              uVar16 = *(uint *)(lVar23 + (uVar24 - 2) * 4);
LAB_0011a295:
              uVar8 = RemSP::Merge(uVar8,uVar16);
              *(uint *)(lVar23 + uVar24 * 4) = uVar8;
              goto LAB_0011a3d2;
            }
LAB_00119f0f:
            if (((uVar15 != 0) && ((long)uVar9 < lVar21)) && (*(char *)(lVar22 + uVar9) != '\0'))
            goto LAB_0011a0c6;
            if ((uVar15 == 0) || (lVar21 <= (long)(uVar24 + 2))) {
              if (uVar15 == 0) goto LAB_0011a136;
            }
            else if (*(char *)(lVar22 + uVar24 + 2) != '\0') {
              if (*(char *)(lVar22 + uVar24) == '\0') goto LAB_0011a245;
              goto LAB_0011a09b;
            }
            if (*(char *)(lVar22 + uVar24) != '\0') goto LAB_0011a0c6;
          }
          else if ((uVar24 != 0) &&
                  ((*(char *)((uVar24 - 1) + lVar13) != '\0' ||
                   (*(char *)(lVar14 + -1 + uVar24) != '\0')))) goto LAB_0011a3c9;
LAB_0011a136:
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar8 = RemSP::length_ + 1;
          *(uint *)(lVar23 + uVar24 * 4) = RemSP::length_;
          RemSP::length_ = uVar8;
        }
        else {
          uVar9 = uVar24 | 1;
          if ((long)uVar9 < lVar21) {
            if (*(char *)(lVar14 + uVar9) != '\0') goto LAB_00119f0f;
            if (((long)uVar20 < lVar10) && (*(char *)(lVar13 + uVar9) != '\0')) goto LAB_0011a136;
          }
          *(undefined4 *)(lVar23 + uVar24 * 4) = 0;
        }
      }
      else {
        if (uVar24 == 0) {
LAB_0011a02b:
          uVar9 = uVar24 | 1;
          if ((uVar15 == 0) || ((lVar21 <= (long)uVar9 || (*(char *)(lVar22 + uVar9) == '\0')))) {
            if (((long)uVar9 < lVar21) &&
               (((*(char *)(lVar14 + uVar9) != '\0' && (uVar15 != 0)) &&
                ((long)(uVar24 + 2) < lVar21)))) {
              if (*(char *)(lVar22 + uVar24 + 2) != '\0') {
                if (*(char *)(lVar22 + uVar24) == '\0') {
                  if ((uVar24 == 0) || (*(char *)(lVar22 + -1 + uVar24) == '\0')) {
LAB_0011a245:
                    uVar8 = *(uint *)(lVar19 + 8 + uVar24 * 4);
                    goto LAB_0011a3ce;
                  }
                  if (*(char *)(lVar17 + uVar9) == '\0') goto LAB_0011a23b;
                  goto LAB_0011a059;
                }
LAB_0011a09b:
                if ((lVar21 <= (long)uVar9) || (*(char *)(lVar17 + uVar9) == '\0')) {
                  uVar8 = *(uint *)(lVar19 + uVar24 * 4);
                  goto LAB_0011a0af;
                }
                goto LAB_0011a0c6;
              }
            }
            else if (uVar15 == 0) goto LAB_0011a136;
            if (*(char *)(lVar22 + uVar24) != '\0') goto LAB_0011a0c6;
            if ((uVar15 == 0 || uVar24 == 0) || (*(char *)(lVar22 + -1 + uVar24) == '\0'))
            goto LAB_0011a136;
          }
          else {
            if (((*(char *)(lVar22 + uVar24) != '\0') || (uVar24 == 0)) ||
               (*(char *)(lVar22 + -1 + uVar24) == '\0')) {
LAB_0011a0c6:
              uVar8 = *(uint *)(lVar19 + uVar24 * 4);
              goto LAB_0011a3ce;
            }
LAB_0011a059:
            if (*(char *)(lVar17 + uVar24) == '\0') {
LAB_0011a1df:
              uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
              goto LAB_0011a1e4;
            }
          }
LAB_0011a106:
          uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
        }
        else {
          if (*(char *)(lVar14 + -1 + uVar24) == '\0') {
            if ((lVar10 <= (long)uVar20) || (*(char *)(lVar13 + -1 + uVar24) == '\0'))
            goto LAB_0011a02b;
            uVar9 = uVar24 | 1;
            if (((uVar15 != 0) && ((long)uVar9 < lVar21)) && (*(char *)(lVar22 + uVar9) != '\0')) {
              if (*(char *)((uVar24 - 2) + lVar14) != '\0') goto LAB_00119fe6;
              if ((*(char *)(lVar22 + uVar24) != '\0') || (*(char *)(lVar22 + -1 + uVar24) == '\0'))
              goto LAB_0011a2c5;
LAB_0011a302:
              if ((uVar15 == 0) || (*(char *)(lVar17 + uVar24) == '\0')) {
                uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
                uVar16 = *(uint *)(lVar19 + uVar24 * 4);
LAB_0011a45f:
                uVar8 = RemSP::Merge(uVar8,uVar16);
                uVar16 = *(uint *)(lVar23 + -8 + uVar24 * 4);
              }
              else {
                uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
LAB_0011a398:
                uVar16 = *(uint *)(lVar23 + -8 + uVar24 * 4);
              }
              goto LAB_0011a295;
            }
            if ((lVar21 <= (long)uVar9) ||
               ((((*(char *)(lVar14 + uVar9) == '\0' || (uVar15 == 0)) ||
                 (lVar21 <= (long)(uVar24 + 2))) || (*(char *)(lVar22 + uVar24 + 2) == '\0')))) {
              if (uVar15 == 0) goto LAB_0011a3c9;
              if (*(char *)(lVar22 + -1 + uVar24) == '\0') {
                if (*(char *)(lVar22 + uVar24) == '\0') goto LAB_0011a3c9;
                if (*(char *)((uVar24 - 2) + lVar14) == '\0') goto LAB_0011a2c5;
                goto LAB_0011a263;
              }
              uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
              if (*(char *)(lVar14 + -2 + uVar24) == '\0') goto LAB_0011a2c9;
LAB_0011a280:
              *(uint *)(lVar23 + uVar24 * 4) = uVar8;
              goto LAB_0011a3d2;
            }
            if (*(char *)(lVar14 + -2 + uVar24) == '\0') {
              if (*(char *)(lVar22 + uVar24) != '\0') {
                uVar8 = *(uint *)(lVar19 + uVar24 * 4);
                if (*(char *)(lVar17 + uVar9) == '\0') {
                  uVar16 = *(uint *)(lVar19 + 8 + uVar24 * 4);
                  goto LAB_0011a45f;
                }
                goto LAB_0011a398;
              }
              if (*(char *)(lVar22 + -1 + uVar24) == '\0') goto LAB_00119f9e;
              if (*(char *)(lVar17 + uVar9) != '\0') goto LAB_0011a302;
              uVar8 = RemSP::Merge(*(uint *)(lVar19 + -8 + uVar24 * 4),
                                   *(uint *)(lVar19 + 8 + uVar24 * 4));
              uVar16 = *(uint *)(lVar23 + -8 + uVar24 * 4);
              goto LAB_0011a2ce;
            }
            if (*(char *)(lVar22 + -1 + uVar24) == '\0') {
              if (*(char *)(lVar17 + uVar9) != '\0') goto LAB_0011a00a;
              if (*(char *)(lVar22 + uVar24) != '\0') {
LAB_0011a3ef:
                lVar1 = uVar24 - 2;
                if ((uVar24 == 0 || uVar15 == 0) || (*(char *)(lVar22 + lVar1) == '\0')) {
                  uVar8 = RemSP::Merge(*(uint *)(lVar19 + uVar24 * 4),
                                       *(uint *)(lVar19 + 8 + uVar24 * 4));
                  uVar16 = *(uint *)(lVar23 + lVar1 * 4);
                  goto LAB_0011a2ce;
                }
                if (*(char *)(lVar12 + uVar24) == '\0') {
                  uVar8 = RemSP::Merge(*(uint *)(lVar19 + uVar24 * 4),
                                       *(uint *)(lVar19 + 8 + uVar24 * 4));
                  uVar16 = *(uint *)(lVar23 + lVar1 * 4);
                }
                else {
                  uVar8 = *(uint *)(lVar19 + lVar1 * 4);
                  uVar16 = *(uint *)(lVar19 + 8 + uVar24 * 4);
                }
                goto LAB_0011a295;
              }
LAB_00119f9e:
              uVar8 = *(uint *)(lVar19 + 8 + uVar24 * 4);
              goto LAB_0011a2c9;
            }
            if (*(char *)(lVar17 + uVar9) != '\0') goto LAB_0011a19e;
LAB_0011a23b:
            uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
LAB_0011a0af:
            uVar16 = *(uint *)(lVar19 + 8 + uVar24 * 4);
          }
          else {
            uVar9 = uVar24 | 1;
            if (((uVar15 == 0) || (lVar21 <= (long)uVar9)) || (*(char *)(lVar22 + uVar9) == '\0')) {
              if (((long)uVar9 < lVar21) && (*(char *)(lVar14 + uVar9) != '\0')) {
LAB_00119f6b:
                if ((uVar15 != 0) &&
                   (((long)(uVar24 + 2) < lVar21 && (*(char *)(lVar22 + uVar24 + 2) != '\0')))) {
                  if (*(char *)(lVar17 + 1 + uVar24) == '\0') goto LAB_00119f9e;
                  goto LAB_00119e5f;
                }
              }
LAB_0011a3c9:
              uVar8 = *(uint *)(lVar23 + -8 + uVar24 * 4);
              goto LAB_0011a3ce;
            }
LAB_00119e5f:
            if (*(char *)(lVar22 + uVar24) != '\0') goto LAB_0011a0c6;
            cVar3 = *(char *)(lVar17 + uVar24);
joined_r0x0011a3be:
            if (cVar3 == '\0') {
LAB_0011a2c5:
              uVar8 = *(uint *)(lVar19 + uVar24 * 4);
LAB_0011a2c9:
              uVar16 = *(uint *)(lVar23 + -8 + uVar24 * 4);
              goto LAB_0011a2ce;
            }
            if (uVar24 == 0 || uVar15 == 0) goto LAB_0011a289;
            if (*(char *)(lVar22 + -1 + uVar24) != '\0') goto LAB_0011a106;
LAB_0011a263:
            if (*(char *)(lVar22 + -2 + uVar24) == '\0') goto LAB_0011a289;
            uVar8 = *(uint *)(lVar19 + -8 + uVar24 * 4);
            if (*(char *)(lVar12 + uVar24) != '\0') goto LAB_0011a280;
LAB_0011a1e4:
            uVar16 = *(uint *)(lVar19 + uVar24 * 4);
          }
LAB_0011a2ce:
          uVar8 = RemSP::Merge(uVar8,uVar16);
        }
LAB_0011a3ce:
        *(uint *)(lVar23 + uVar24 * 4) = uVar8;
      }
LAB_0011a3d2:
    }
  }
  uVar8 = RemSP::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar8;
  puVar6 = RemSP::P_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar8 = *(uint *)&pMVar5->field_0x8;
  local_d8 = *(uint *)&pMVar5->field_0xc & 0x80000001;
  uVar15 = (long)(int)*(uint *)&pMVar5->field_0xc & 0xfffffffffffffffe;
  lVar10 = 1;
  lVar21 = 0;
  do {
    puVar7 = RemSP::P_;
    if ((long)((long)(int)uVar8 & 0xfffffffffffffffeU) <= lVar21) {
      if ((uVar8 & 0x80000001) == 1) {
        lVar12 = **(long **)&pMVar4->field_0x48 * lVar21 + *(long *)&pMVar4->field_0x10;
        lVar10 = lVar21 * **(long **)&pMVar5->field_0x48 + *(long *)&pMVar5->field_0x10;
        for (lVar21 = 0; lVar21 < (long)uVar15; lVar21 = lVar21 + 2) {
          lVar13 = (long)*(int *)(lVar10 + lVar21 * 4);
          if (lVar13 < 1) {
            *(undefined8 *)(lVar10 + lVar21 * 4) = 0;
          }
          else {
            uVar8 = puVar7[lVar13];
            uVar16 = uVar8;
            if (*(char *)(lVar12 + lVar21) == '\0') {
              uVar16 = 0;
            }
            *(uint *)(lVar10 + lVar21 * 4) = uVar16;
            if (*(char *)(lVar12 + 1 + lVar21) == '\0') {
              *(undefined4 *)(lVar10 + 4 + lVar21 * 4) = 0;
            }
            else {
              *(uint *)(lVar10 + 4 + lVar21 * 4) = uVar8;
            }
          }
        }
        if (local_d8 == 1) {
          lVar13 = (long)*(int *)(lVar10 + lVar21 * 4);
          uVar8 = 0;
          if ((0 < lVar13) && (uVar8 = 0, *(char *)(lVar21 + lVar12) != '\0')) {
            uVar8 = RemSP::P_[lVar13];
          }
          *(uint *)(lVar10 + lVar21 * 4) = uVar8;
        }
      }
      RemSP::Dealloc();
      return;
    }
    lVar12 = **(long **)&pMVar5->field_0x48;
    lVar19 = lVar12 * lVar21 + *(long *)&pMVar5->field_0x10;
    lVar17 = lVar12 * lVar10 + *(long *)&pMVar5->field_0x10;
    lVar14 = **(long **)&pMVar4->field_0x48 * lVar10 + *(long *)&pMVar4->field_0x10;
    lVar13 = **(long **)&pMVar4->field_0x48 * lVar21 + *(long *)&pMVar4->field_0x10;
    for (uVar20 = 0; (long)uVar20 < (long)uVar15; uVar20 = uVar20 + 2) {
      lVar22 = (long)*(int *)(lVar19 + uVar20 * 4);
      if (lVar22 < 1) {
        *(undefined8 *)(lVar19 + uVar20 * 4) = 0;
        uVar24 = uVar20 | 1;
        *(undefined4 *)(lVar17 + uVar20 * 4) = 0;
        uVar16 = 0;
      }
      else {
        uVar16 = puVar7[lVar22];
        uVar18 = uVar16;
        if (*(char *)(lVar13 + uVar20) == '\0') {
          uVar18 = 0;
        }
        *(uint *)(lVar19 + uVar20 * 4) = uVar18;
        uVar18 = uVar16;
        if (*(char *)(lVar13 + 1 + uVar20) == '\0') {
          uVar18 = 0;
        }
        uVar24 = uVar20 + 1;
        *(uint *)(lVar19 + 4 + uVar20 * 4) = uVar18;
        uVar18 = uVar16;
        if (*(char *)(lVar14 + uVar20) == '\0') {
          uVar18 = 0;
        }
        *(uint *)(lVar17 + uVar20 * 4) = uVar18;
        if (*(char *)(lVar14 + 1 + uVar20) == '\0') {
          uVar16 = 0;
        }
      }
      *(uint *)(lVar19 + lVar12 + uVar24 * 4) = uVar16;
    }
    if (local_d8 == 1) {
      lVar12 = (long)*(int *)(lVar19 + uVar20 * 4);
      if (lVar12 < 1) {
        *(undefined4 *)(lVar19 + uVar20 * 4) = 0;
      }
      else {
        uVar16 = puVar6[lVar12];
        uVar18 = uVar16;
        if (*(char *)(uVar20 + lVar13) == '\0') {
          uVar18 = 0;
        }
        *(uint *)(lVar19 + uVar20 * 4) = uVar18;
        if (*(char *)(uVar20 + lVar14) != '\0') {
          *(uint *)(lVar17 + uVar20 * 4) = uVar16;
          goto LAB_0011a650;
        }
      }
      *(undefined4 *)(lVar17 + uVar20 * 4) = 0;
    }
LAB_0011a650:
    lVar21 = lVar21 + 2;
    lVar10 = lVar10 + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }